

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_pileup1_t * bam_plp_next(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  __linkbuf_t *p_Var1;
  bool bVar2;
  int iVar3;
  bam_pileup1_t *pbVar4;
  int local_50;
  lbnode_t *local_48;
  lbnode_t *q;
  lbnode_t *p;
  int n_plp;
  int *_n_plp_local;
  int *_pos_local;
  int *_tid_local;
  bam_plp_t iter_local;
  
  if (iter->error == 0) {
    *_n_plp = 0;
    if (iter->is_eof == 0) goto LAB_0011c65b;
    p_Var1 = iter->head->next;
    while (p_Var1 != (__linkbuf_t *)0x0) {
LAB_0011c65b:
      do {
        bVar2 = true;
        if (((iter->is_eof == 0) && (bVar2 = true, iter->max_tid <= iter->tid)) &&
           (bVar2 = false, iter->max_tid == iter->tid)) {
          bVar2 = iter->pos < iter->max_pos;
        }
        if (!bVar2) {
          return (bam_pileup1_t *)0x0;
        }
        p._4_4_ = 0;
        iter->dummy->next = iter->head;
        local_48 = iter->dummy;
        for (q = iter->head; q->next != (__linkbuf_t *)0x0; q = q->next) {
          if (((q->b).core.tid < iter->tid) ||
             (((q->b).core.tid == iter->tid && (q->end <= iter->pos)))) {
            overlap_remove(iter,&q->b);
            local_48->next = q->next;
            mp_free(iter->mp,q);
            q = local_48;
          }
          else if (((q->b).core.tid == iter->tid) && (q->beg <= iter->pos)) {
            if (p._4_4_ == iter->max_plp) {
              if (iter->max_plp == 0) {
                local_50 = 0x100;
              }
              else {
                local_50 = iter->max_plp << 1;
              }
              iter->max_plp = local_50;
              pbVar4 = (bam_pileup1_t *)realloc(iter->plp,(long)iter->max_plp * 0x18);
              iter->plp = pbVar4;
            }
            iter->plp[p._4_4_].b = &q->b;
            iVar3 = resolve_cigar2(iter->plp + p._4_4_,iter->pos,&q->s);
            if (iVar3 != 0) {
              p._4_4_ = p._4_4_ + 1;
            }
          }
          local_48 = q;
        }
        iter->head = iter->dummy->next;
        *_n_plp = p._4_4_;
        *_tid = iter->tid;
        *_pos = iter->pos;
        if ((iter->head->next != (__linkbuf_t *)0x0) && ((iter->head->b).core.tid < iter->tid)) {
          fprintf(_stderr,"[%s] unsorted input. Pileup aborts.\n","bam_plp_next");
          iter->error = 1;
          *_n_plp = -1;
          return (bam_pileup1_t *)0x0;
        }
        if (iter->tid < (iter->head->b).core.tid) {
          iter->tid = (iter->head->b).core.tid;
          iter->pos = iter->head->beg;
        }
        else if (iter->pos < iter->head->beg) {
          iter->pos = iter->head->beg;
        }
        else {
          iter->pos = iter->pos + 1;
        }
        if (p._4_4_ != 0) {
          return iter->plp;
        }
      } while (iter->is_eof == 0);
      p_Var1 = iter->head->next;
    }
  }
  else {
    *_n_plp = -1;
  }
  return (bam_pileup1_t *)0x0;
}

Assistant:

const bam_pileup1_t *bam_plp_next(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    if (iter->error) { *_n_plp = -1; return 0; }
    *_n_plp = 0;
    if (iter->is_eof && iter->head->next == 0) return 0;
    while (iter->is_eof || iter->max_tid > iter->tid || (iter->max_tid == iter->tid && iter->max_pos > iter->pos)) {
        int n_plp = 0;
        lbnode_t *p, *q;
        // write iter->plp at iter->pos
        iter->dummy->next = iter->head;
        for (p = iter->head, q = iter->dummy; p->next; q = p, p = p->next) {
            if (p->b.core.tid < iter->tid || (p->b.core.tid == iter->tid && p->end <= iter->pos)) { // then remove
                overlap_remove(iter, &p->b);
                q->next = p->next; mp_free(iter->mp, p); p = q;
            } else if (p->b.core.tid == iter->tid && p->beg <= iter->pos) { // here: p->end > pos; then add to pileup
                if (n_plp == iter->max_plp) { // then double the capacity
                    iter->max_plp = iter->max_plp? iter->max_plp<<1 : 256;
                    iter->plp = (bam_pileup1_t*)realloc(iter->plp, sizeof(bam_pileup1_t) * iter->max_plp);
                }
                iter->plp[n_plp].b = &p->b;
                if (resolve_cigar2(iter->plp + n_plp, iter->pos, &p->s)) ++n_plp; // actually always true...
            }
        }
        iter->head = iter->dummy->next; // dummy->next may be changed
        *_n_plp = n_plp; *_tid = iter->tid; *_pos = iter->pos;
        // update iter->tid and iter->pos
        if (iter->head->next) {
            if (iter->tid > iter->head->b.core.tid) {
                fprintf(stderr, "[%s] unsorted input. Pileup aborts.\n", __func__);
                iter->error = 1;
                *_n_plp = -1;
                return 0;
            }
        }
        if (iter->tid < iter->head->b.core.tid) { // come to a new reference sequence
            iter->tid = iter->head->b.core.tid; iter->pos = iter->head->beg; // jump to the next reference
        } else if (iter->pos < iter->head->beg) { // here: tid == head->b.core.tid
            iter->pos = iter->head->beg; // jump to the next position
        } else ++iter->pos; // scan contiguously
        // return
        if (n_plp) return iter->plp;
        if (iter->is_eof && iter->head->next == 0) break;
    }
    return 0;
}